

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::ConstantNamePrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view classname)

{
  long *__s1;
  bool bVar1;
  int iVar2;
  char *extraout_RDX;
  long lVar3;
  size_type __rlen;
  string_view name;
  string lower;
  long *local_50;
  php *local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,classname._M_len,this + classname._M_len,classname._M_str);
  absl::lts_20240722::AsciiStrToLower((string *)&local_50);
  name._M_str = extraout_RDX;
  name._M_len = (size_t)local_50;
  bVar1 = IsReservedName(local_48,name);
  __s1 = local_50;
  lVar3 = 8;
  do {
    if (local_48 == *(php **)((long)&PTR_typeinfo_00523328 + lVar3)) {
      if (local_48 == (php *)0x0) goto LAB_002f37aa;
      iVar2 = bcmp(__s1,*(void **)((long)&kValidConstantNames[0]._M_len + lVar3),(size_t)local_48);
      if (iVar2 == 0) goto LAB_002f37aa;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 200);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"PB","");
  }
  else {
LAB_002f37aa:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantNamePrefix(absl::string_view classname) {
  bool is_reserved = false;

  std::string lower = absl::AsciiStrToLower(classname);

  is_reserved = IsReservedName(lower);

  for (int i = 0; i < kValidConstantNamesSize; i++) {
    if (lower == kValidConstantNames[i]) {
      is_reserved = false;
      break;
    }
  }

  if (is_reserved) {
    return "PB";
  }

  return "";
}